

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O0

void __thiscall CTilesetMapper::Load(CTilesetMapper *this,json_value *rElement)

{
  long lVar1;
  _json_value *p_Var2;
  _json_value *p_Var3;
  _json_value *this_00;
  _json_value *in_RSI;
  long in_FS_OFFSET;
  json_value *rValue;
  uint k;
  json_value *rCondition;
  json_value *rVFlip;
  json_value *rHFlip;
  json_value *rRotate;
  json_value *rRandom;
  json_value *rIndex;
  uint j;
  json_value *rRuleNode;
  json_value *rBasetile;
  json_value *rStart;
  char *pConfName;
  uint i;
  CRuleCondition Condition;
  CRule NewRule;
  CRuleSet NewRuleSet;
  CRuleSet *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  _json_value *in_stack_fffffffffffffda8;
  uint local_15c;
  uint local_124;
  uint local_ec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_ec = 0; local_ec < (in_RSI->u).string.length; local_ec = local_ec + 1) {
    p_Var2 = _json_value::operator[](in_RSI,local_ec);
    if ((p_Var2->u).boolean == 1) {
      CRuleSet::CRuleSet((CRuleSet *)0x1e20ab);
      _json_value::operator[](in_RSI,local_ec);
      str_copy((char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd98->m_aName,0);
      _json_value::operator[](in_RSI,local_ec);
      p_Var2 = _json_value::operator[]
                         (in_stack_fffffffffffffda8,
                          (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      if (p_Var2->type == json_integer) {
        clamp<int>((p_Var2->u).boolean,0,0xff);
      }
      p_Var2 = _json_value::operator[]
                         (in_stack_fffffffffffffda8,
                          (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
      for (local_124 = 0; local_124 < (p_Var2->u).string.length && local_124 < 0x100;
          local_124 = local_124 + 1) {
        CRule::CRule((CRule *)0x1e224e);
        _json_value::operator[](p_Var2,local_124);
        p_Var3 = _json_value::operator[]
                           (in_stack_fffffffffffffda8,
                            (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        if (p_Var3->type == json_integer) {
          clamp<int>((p_Var3->u).boolean,0,0xff);
        }
        _json_value::operator[](p_Var2,local_124);
        p_Var3 = _json_value::operator[]
                           (in_stack_fffffffffffffda8,
                            (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        if (p_Var3->type == json_integer) {
          clamp<int>((p_Var3->u).boolean,0,99999);
        }
        _json_value::operator[](p_Var2,local_124);
        _json_value::operator[]
                  (in_stack_fffffffffffffda8,
                   (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        _json_value::operator[](p_Var2,local_124);
        p_Var3 = _json_value::operator[]
                           (in_stack_fffffffffffffda8,
                            (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        if (p_Var3->type == json_integer) {
          clamp<int>((p_Var3->u).boolean,0,1);
        }
        _json_value::operator[](p_Var2,local_124);
        p_Var3 = _json_value::operator[]
                           (in_stack_fffffffffffffda8,
                            (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        if (p_Var3->type == json_integer) {
          clamp<int>((p_Var3->u).boolean,0,1);
        }
        _json_value::operator[](p_Var2,local_124);
        p_Var3 = _json_value::operator[]
                           (in_stack_fffffffffffffda8,
                            (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
        if (p_Var3->type == json_array) {
          for (local_15c = 0; local_15c < (p_Var3->u).string.length; local_15c = local_15c + 1) {
            _json_value::operator[](p_Var3,local_15c);
            _json_value::operator[]
                      (in_stack_fffffffffffffda8,
                       (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
            _json_value::operator[](p_Var3,local_15c);
            _json_value::operator[]
                      (in_stack_fffffffffffffda8,
                       (char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
            _json_value::operator[](p_Var3,local_15c);
            this_00 = _json_value::operator[]
                                (in_stack_fffffffffffffda8,
                                 (char *)CONCAT44(in_stack_fffffffffffffda4,
                                                  in_stack_fffffffffffffda0));
            if (this_00->type == json_string) {
              in_stack_fffffffffffffda8 =
                   (_json_value *)_json_value::operator_cast_to_char_(this_00);
              in_stack_fffffffffffffda4 =
                   str_comp((char *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                            in_stack_fffffffffffffd98->m_aName);
            }
            else if (this_00->type == json_integer) {
              in_stack_fffffffffffffda0 = clamp<int>((this_00->u).boolean,-2,0xff);
            }
            array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
            ::add((array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
                   *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                  (CRuleCondition *)in_stack_fffffffffffffd98);
          }
        }
        array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::add
                  ((array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (CRule *)in_stack_fffffffffffffd98);
        CRule::~CRule((CRule *)0x1e278f);
      }
      array<CTilesetMapper::CRuleSet,_allocator_default<CTilesetMapper::CRuleSet>_>::add
                ((array<CTilesetMapper::CRuleSet,_allocator_default<CTilesetMapper::CRuleSet>_> *)
                 CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 in_stack_fffffffffffffd98);
      CRuleSet::~CRuleSet((CRuleSet *)0x1e27cd);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CTilesetMapper::Load(const json_value &rElement)
{
	for(unsigned i = 0; i < rElement.u.array.length; ++i)
	{
		if(rElement[i].u.object.length != 1)
			continue;

		// new rule set
		CRuleSet NewRuleSet;
		const char* pConfName = rElement[i].u.object.values[0].name;
		str_copy(NewRuleSet.m_aName, pConfName, sizeof(NewRuleSet.m_aName));
		const json_value &rStart = *(rElement[i].u.object.values[0].value);

		// get basetile
		const json_value &rBasetile = rStart["basetile"];
		if(rBasetile.type == json_integer)
			NewRuleSet.m_BaseTile = clamp((int)rBasetile.u.integer, 0, 255);
		else
			NewRuleSet.m_BaseTile = 1;

		// get rules
		const json_value &rRuleNode = rStart["rules"];
		for(unsigned j = 0; j < rRuleNode.u.array.length && j < MAX_RULES; j++)
		{
			// create a new rule
			CRule NewRule;

			// index
			const json_value &rIndex = rRuleNode[j]["index"];
			if(rIndex.type == json_integer)
				NewRule.m_Index = clamp((int)rIndex.u.integer, 0, 255);
			else
				NewRule.m_Index = 1;

			// random
			const json_value &rRandom = rRuleNode[j]["random"];
			if(rRandom.type == json_integer)
				NewRule.m_Random = clamp((int)rRandom.u.integer, 0, 99999);
			else
				NewRule.m_Random = 0;

			// rotate
			const json_value &rRotate = rRuleNode[j]["rotate"];
			if(rRotate.type == json_integer && (rRotate.u.integer == 90 || rRotate.u.integer == 180 || rRotate.u.integer == 270))
				NewRule.m_Rotation = rRotate.u.integer;
			else
				NewRule.m_Rotation = 0;

			// hflip
			const json_value &rHFlip = rRuleNode[j]["hflip"];
			if(rHFlip.type == json_integer)
				NewRule.m_HFlip = clamp((int)rHFlip.u.integer, 0, 1);
			else
				NewRule.m_HFlip = 0;

			// vflip
			const json_value &rVFlip = rRuleNode[j]["vflip"];
			if(rVFlip.type == json_integer)
				NewRule.m_VFlip = clamp((int)rVFlip.u.integer, 0, 1);
			else
				NewRule.m_VFlip = 0;

			// get rule's content
			const json_value &rCondition = rRuleNode[j]["condition"];
			if(rCondition.type == json_array)
			{
				for(unsigned k = 0; k < rCondition.u.array.length; k++)
				{
					CRuleCondition Condition;

					Condition.m_X = rCondition[k]["x"].u.integer;
					Condition.m_Y = rCondition[k]["y"].u.integer;
					const json_value &rValue = rCondition[k]["value"];
					if(rValue.type == json_string)
					{
						// the value is not an index, check if it's full or empty
						if(str_comp((const char *)rValue, "full") == 0)
							Condition.m_Value = CRuleCondition::FULL;
						else
							Condition.m_Value = CRuleCondition::EMPTY;
					}
					else if(rValue.type == json_integer)
						Condition.m_Value = clamp((int)rValue.u.integer, (int)CRuleCondition::EMPTY, 255);
					else
						Condition.m_Value = CRuleCondition::EMPTY;

					NewRule.m_aConditions.add(Condition);
				}
			}

			NewRuleSet.m_aRules.add(NewRule);
		}

		m_aRuleSets.add(NewRuleSet);
	}
}